

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testToFloat"), iVar1 == 0)) {
    testToFloat();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testSize"), iVar1 == 0)) {
    testSize();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testArithmetic"), iVar1 == 0)) {
    testArithmetic();
  }
  if ((in_EDI < 2) ||
     (iVar1 = strcmp(*(char **)(in_RSI + 8),"testNormalizedConversionError"), iVar1 == 0)) {
    testNormalizedConversionError();
  }
  if ((in_EDI < 2) ||
     (iVar1 = strcmp(*(char **)(in_RSI + 8),"testDenormalizedConversionError"), iVar1 == 0)) {
    testDenormalizedConversionError();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testRoundingError"), iVar1 == 0)) {
    testRoundingError();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testBitPatterns"), iVar1 == 0)) {
    testBitPatterns();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testClassification"), iVar1 == 0)) {
    testClassification();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testLimits"), iVar1 == 0)) {
    testLimits();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testHalfLimits"), iVar1 == 0)) {
    testHalfLimits();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testFunction"), iVar1 == 0)) {
    testFunction();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testVec"), iVar1 == 0)) {
    testVec();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testColor"), iVar1 == 0)) {
    testColor();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testShear"), iVar1 == 0)) {
    testShear();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testMatrix"), iVar1 == 0)) {
    testMatrix();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testMiscMatrixAlgo"), iVar1 == 0)) {
    testMiscMatrixAlgo();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testRoots"), iVar1 == 0)) {
    testRoots();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testFun"), iVar1 == 0)) {
    testFun();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testInvert"), iVar1 == 0)) {
    testInvert();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testInterval"), iVar1 == 0)) {
    testInterval();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testFrustum"), iVar1 == 0)) {
    testFrustum();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testRandom"), iVar1 == 0)) {
    testRandom();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testExtractEuler"), iVar1 == 0)) {
    testExtractEuler();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testExtractSHRT"), iVar1 == 0)) {
    testExtractSHRT();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testQuat"), iVar1 == 0)) {
    testQuat();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testQuatSetRotation"), iVar1 == 0)) {
    testQuatSetRotation();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testQuatSlerp"), iVar1 == 0)) {
    testQuatSlerp();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testLineAlgo"), iVar1 == 0)) {
    testLineAlgo();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testBoxAlgo"), iVar1 == 0)) {
    testBoxAlgo();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testBox"), iVar1 == 0)) {
    testBox();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testProcrustes"), iVar1 == 0)) {
    testProcrustes();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testTinySVD"), iVar1 == 0)) {
    testTinySVD();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testJacobiEigenSolver"), iVar1 == 0))
  {
    testJacobiEigenSolver();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testFrustumTest"), iVar1 == 0)) {
    testFrustumTest();
  }
  if ((in_EDI < 2) || (iVar1 = strcmp(*(char **)(in_RSI + 8),"testInterop"), iVar1 == 0)) {
    testInterop();
  }
  if ((1 < in_EDI) && (iVar1 = strcmp(*(char **)(in_RSI + 8),"testNoInterop"), iVar1 != 0)) {
    return 0;
  }
  testNoInterop();
  return 0;
}

Assistant:

int
main (int argc, char* argv[])
{
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite
    TEST (testToFloat);
    TEST (testSize);
    TEST (testArithmetic);
    TEST (testNormalizedConversionError);
    TEST (testDenormalizedConversionError);
    TEST (testRoundingError);
    TEST (testBitPatterns);
    TEST (testClassification);
    TEST (testLimits);
    TEST (testHalfLimits);
    TEST (testFunction);
    TEST (testVec);
    TEST (testColor);
    TEST (testShear);
    TEST (testMatrix);
    TEST (testMiscMatrixAlgo);
    TEST (testRoots);
    TEST (testFun);
    TEST (testInvert);
    TEST (testInterval);
    TEST (testFrustum);
    TEST (testRandom);
    TEST (testExtractEuler);
    TEST (testExtractSHRT);
    TEST (testQuat);
    TEST (testQuatSetRotation);
    TEST (testQuatSlerp);
    TEST (testLineAlgo);
    TEST (testBoxAlgo);
    TEST (testBox);
    TEST (testProcrustes);
    TEST (testTinySVD);
    TEST (testJacobiEigenSolver);
    TEST (testFrustumTest);
    TEST (testInterop);
    TEST (testNoInterop);
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite

    return 0;
}